

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

string * handle_ladder_page_abi_cxx11_(string_view query_string)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *this;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_> *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppLVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  LadderDatabase **database;
  iterator __end3;
  iterator __begin3;
  vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_> *__range3;
  string_view local_108;
  undefined1 auStack_f8 [8];
  string_view db_name;
  uint8_t local_b5;
  uint8_t format;
  size_t local_a8;
  size_t count;
  size_t start_index;
  LadderDatabase *db;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *table;
  undefined1 local_78 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  parsed_query;
  string_view query_string_local;
  
  parsed_query.second._M_h._M_single_bucket = (__node_base_ptr)query_string._M_len;
  parse_query_string_abi_cxx11_
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
              *)local_78,query_string);
  this = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *)(&parsed_query.first.field_2._M_allocated_capacity + 1);
  start_index = RenX::default_ladder_database;
  count = 0;
  local_a8 = RenX_Ladder_WebPlugin::getEntriesPerPage(&pluginInstance);
  local_b5 = 0xff;
  sVar2 = std::
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::size(this);
  if (sVar2 != 0) {
    bVar4 = sv("format",6);
    local_b5 = from_table_value<unsigned_char>(this,bVar4,0xff);
    bVar4 = sv("start",5);
    count = from_table_value<unsigned_long>(this,bVar4,0);
    join_0x00000010_0x00000000_ = sv("count",5);
    local_a8 = from_table_value<unsigned_long>(this,join_0x00000010_0x00000000_,local_a8);
    local_108 = sv("database",8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3);
    sVar5 = get_table_value(this,local_108,___range3);
    db_name._M_len = (size_t)sVar5._M_str;
    auStack_f8 = (undefined1  [8])sVar5._M_len;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f8);
    this_00 = RenX::ladder_databases;
    if (!bVar1) {
      start_index = 0;
      __end3 = std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::begin
                         (RenX::ladder_databases);
      database = (LadderDatabase **)
                 std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::end
                           (this_00);
      while (bVar1 = __gnu_cxx::
                     operator==<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
                               (&__end3,(__normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
                                         *)&database), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
                  ::operator*(&__end3);
        lhs = (basic_string_view<char,_std::char_traits<char>_>)RenX::LadderDatabase::getName();
        bVar4._M_str = (char *)db_name._M_len;
        bVar4._M_len = (size_t)auStack_f8;
        bVar1 = jessilib::equalsi<char,char>(lhs,bVar4);
        if (bVar1) {
          start_index = (size_t)*ppLVar3;
          break;
        }
        __gnu_cxx::
        __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
        ::operator++(&__end3);
      }
    }
  }
  if (start_index == 0) {
    query_string_local._M_str = (char *)generate_no_db_page_abi_cxx11_(this);
  }
  else {
    query_string_local._M_str =
         (char *)RenX_Ladder_WebPlugin::generate_ladder_page_abi_cxx11_
                           (&pluginInstance,(LadderDatabase *)start_index,local_b5,count,local_a8,
                            this);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
           *)local_78);
  return (string *)query_string_local._M_str;
}

Assistant:

std::string* handle_ladder_page(std::string_view query_string) {
	auto parsed_query = parse_query_string(query_string);
	auto& table = parsed_query.second;
	RenX::LadderDatabase *db = RenX::default_ladder_database;
	size_t start_index = 0, count = pluginInstance.getEntriesPerPage();
	uint8_t format = 0xFF;

	if (table.size() != 0) {
		format = from_table_value<uint8_t>(table, "format"sv, format);
		start_index = from_table_value<size_t>(table, "start"sv, start_index);
		count = from_table_value<size_t>(table, "count"sv, count);
		
		std::string_view db_name = get_table_value(table, "database"sv, {});
		if (!db_name.empty()) {
			db = nullptr;
			for (const auto& database : RenX::ladder_databases) {
				if (jessilib::equalsi(std::string_view{database->getName()}, db_name)) {
					db = database;
					break;
				}
			}
		}
	}

	if (db == nullptr) {
		return generate_no_db_page(table);
	}

	return pluginInstance.generate_ladder_page(db, format, start_index, count, table);
}